

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O2

exr_result_t
DwaCompressor_uncompress
          (DwaCompressor *me,uint8_t *inPtr,uint64_t iSize,void *uncompressed_data,
          uint64_t uncompressed_size)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  char cVar3;
  int iVar4;
  CompressorScheme CVar5;
  uint uVar6;
  char *out_bytes_avail;
  ulong outsz;
  ulong nRaw;
  ulong uVar7;
  ulong uVar8;
  uint16_t *raw;
  exr_decode_pipeline_t *peVar9;
  ChannelData *pCVar10;
  CscChannelSet *pCVar11;
  exr_coding_channel_info_t *peVar12;
  uint8_t *puVar13;
  char *newsz;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int x;
  exr_result_t eVar48;
  uint uVar49;
  int iVar50;
  Classifier *__s;
  uint8_t *puVar51;
  uint64_t uVar52;
  long lVar53;
  ulong uVar54;
  int iVar55;
  long lVar56;
  ulong uVar57;
  size_t __n;
  size_t sVar58;
  uint8_t *puVar59;
  ulong uVar60;
  ulong uVar61;
  size_t c;
  ulong uVar62;
  size_t bytes;
  long lVar63;
  bool bVar64;
  ushort *local_100;
  uint8_t *local_e0;
  uint8_t *local_b0;
  Classifier tmpc;
  uint64_t readHere;
  ulong local_40;
  uint8_t *tmpPtr;
  
  if (iSize < 0x58) {
    return 0x17;
  }
  memset(uncompressed_data,0,uncompressed_size);
  uVar62 = *(ulong *)(inPtr + 0x28);
  if (iSize < uVar62) {
    return 0x17;
  }
  uVar61 = *(ulong *)(inPtr + 0x20);
  if (iSize < uVar61) {
    return 0x17;
  }
  uVar60 = *(ulong *)(inPtr + 0x18);
  if (iSize < uVar60) {
    return 0x17;
  }
  uVar54 = *(ulong *)(inPtr + 0x10);
  if (iSize < uVar54) {
    return 0x17;
  }
  if (iSize < uVar54 + uVar60 + uVar61 + uVar62 + 0x58) {
    return 0x17;
  }
  uVar57 = *(ulong *)(inPtr + 8);
  out_bytes_avail = *(char **)(inPtr + 0x30);
  outsz = *(ulong *)(inPtr + 0x38);
  nRaw = *(ulong *)(inPtr + 0x40);
  uVar7 = *(ulong *)(inPtr + 0x48);
  if ((long)(uVar62 | (ulong)out_bytes_avail | outsz | uVar60 | uVar61 | uVar54 | uVar57 | nRaw |
            uVar7) < 0) {
    return 0x17;
  }
  uVar8 = *(ulong *)inPtr;
  lVar56 = *(long *)(inPtr + 0x50);
  local_100 = (ushort *)(inPtr + 0x58);
  if (uVar8 < 2) {
    me->_channelRules = sLegacyChannelRules;
    me->_channelRuleCount = 0x19;
  }
  else {
    if (iSize - 0x58 < 3) {
      return 0x17;
    }
    local_40 = (ulong)*local_100;
    if (iSize - 0x58 < local_40 || local_40 < 2) {
      return 0x17;
    }
    local_b0 = inPtr + 0x5a;
    uVar52 = local_40 - 2;
    bytes = 0;
    eVar48 = 0;
    sVar58 = 0;
    tmpPtr = local_b0;
    while ((eVar48 == 0 && (uVar52 != 0))) {
      tmpc._cscIdx = 0;
      tmpc._caseInsensitive = '\0';
      tmpc._stringStatic = '\0';
      tmpc._22_2_ = 0;
      tmpc._suffix = (char *)0x0;
      tmpc._scheme = UNKNOWN;
      tmpc._type = EXR_PIXEL_UINT;
      readHere = 0;
      eVar48 = Classifier_read(&tmpc,&tmpPtr,&readHere);
      uVar52 = readHere;
      Classifier_destroy(&tmpc);
      sVar58 = sVar58 + 1;
      bytes = bytes + 0x18;
    }
    if (eVar48 != 0) {
      return eVar48;
    }
    me->_channelRuleCount = sVar58;
    __s = (Classifier *)internal_exr_alloc(bytes);
    me->_channelRules = __s;
    if (__s == (Classifier *)0x0) {
      return 1;
    }
    local_100 = (ushort *)((long)local_100 + local_40);
    lVar53 = 0;
    memset(__s,0,bytes);
    while (bVar64 = sVar58 != 0, sVar58 = sVar58 - 1, bVar64) {
      auVar45._8_8_ = 0;
      auVar45._0_4_ = tmpc._scheme;
      auVar45._4_4_ = tmpc._type;
      tmpc._0_16_ = auVar45 << 0x40;
      Classifier_read((Classifier *)((long)&me->_channelRules->_suffix + lVar53),&local_b0,
                      (uint64_t *)&tmpc);
      lVar53 = lVar53 + 0x18;
    }
  }
  eVar48 = DwaCompressor_initializeBuffers(me,(size_t *)&local_b0);
  if (eVar48 != 0) {
    return eVar48;
  }
  puVar59 = (uint8_t *)me->_decode->unpacked_buffer;
  local_b0 = (uint8_t *)me->_decode->unpacked_alloc_size;
  if (2 < uVar8) {
    return 0x16;
  }
  local_e0 = me->_packedAcBuffer;
  DwaCompressor_setupChannelData(me);
  if (uVar54 != 0) {
    if (me->_planarUncBufferSize[0] < uVar57) {
      return 0x17;
    }
    eVar48 = exr_uncompress_buffer(local_100,uVar54,me->_planarUncBuffer[0],uVar57,(size_t *)0x0);
    if (eVar48 != 0) {
      return 0x17;
    }
  }
  puVar51 = (uint8_t *)((long)local_100 + uVar54);
  if (uVar60 != 0) {
    raw = (uint16_t *)me->_packedAcBuffer;
    if (raw == (uint16_t *)0x0) {
      return 0x17;
    }
    uVar54 = nRaw * 2;
    if (me->_packedAcBufferSize <= uVar54 && uVar54 - me->_packedAcBufferSize != 0) {
      return 0x17;
    }
    if (lVar56 == 1) {
      eVar48 = exr_uncompress_buffer(puVar51,uVar60,raw,uVar54,(size_t *)&tmpc);
      if (eVar48 != 0) {
        return eVar48;
      }
      if (uVar54 - (long)tmpc._suffix != 0) {
        return 0x17;
      }
    }
    else {
      if (lVar56 != 0) {
        return 0x17;
      }
      peVar9 = me->_decode;
      eVar48 = internal_huf_decompress
                         (peVar9,puVar51,uVar60,raw,nRaw,peVar9->scratch_buffer_1,
                          peVar9->scratch_alloc_size_1);
      if (eVar48 != 0) {
        return eVar48;
      }
    }
  }
  if (uVar61 == 0) {
    if (uVar7 == 0) goto LAB_00108839;
LAB_001087a6:
    eVar48 = 0x17;
  }
  else {
    newsz = (char *)(uVar7 * 2);
    if ((char *)me->_packedDcBufferSize < newsz) {
      return 0x17;
    }
    peVar9 = me->_decode;
    eVar48 = internal_decode_alloc_buffer
                       (peVar9,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar9->scratch_buffer_1,
                        &peVar9->scratch_alloc_size_1,(size_t)newsz);
    if (eVar48 != 0) {
      return eVar48;
    }
    eVar48 = exr_uncompress_buffer
                       (puVar51 + uVar60,uVar61,me->_decode->scratch_buffer_1,(size_t)newsz,
                        (size_t *)&tmpc);
    if (eVar48 != 0) {
      return 0x17;
    }
    if (newsz != tmpc._suffix) {
      return 0x17;
    }
    internal_zip_reconstruct_bytes
              (me->_packedDcBuffer,(uint8_t *)me->_decode->scratch_buffer_1,(uint64_t)newsz);
LAB_00108839:
    if (outsz != 0) {
      if ((char *)me->_rleBufferSize < out_bytes_avail) {
        return 0x17;
      }
      if (me->_planarUncBufferSize[2] < outsz) {
        return 0x17;
      }
      eVar48 = exr_uncompress_buffer
                         (puVar51 + uVar60 + uVar61,uVar62,me->_rleBuffer,(size_t)out_bytes_avail,
                          (size_t *)&tmpc);
      if ((eVar48 != 0) || (tmpc._suffix != out_bytes_avail)) goto LAB_001087a6;
      uVar52 = internal_rle_decompress
                         (me->_planarUncBuffer[2],outsz,me->_rleBuffer,(uint64_t)out_bytes_avail);
      if (uVar52 != outsz) {
        return 0x17;
      }
    }
    iVar55 = me->_numChannels;
    lVar53 = (long)iVar55;
    lVar56 = 0xc;
    while (bVar64 = lVar53 != 0, lVar53 = lVar53 + -1, bVar64) {
      *(undefined4 *)((long)(me->_channelData->_dctData)._dctData + lVar56 + -0x20) = 0;
      lVar56 = lVar56 + 0x240;
    }
    iVar50 = me->_min[1];
    while( true ) {
      eVar48 = 0;
      iVar4 = me->_max[1];
      if (iVar4 < iVar50) break;
      lVar56 = 0x20;
      for (uVar62 = 0; uVar62 < (ulong)(long)iVar55; uVar62 = uVar62 + 1) {
        lVar53 = *(long *)((long)(me->_channelData->_dctData)._dctData + lVar56 + -0x40);
        if (iVar50 % *(int *)(lVar53 + 0x14) == 0) {
          eVar48 = DctCoderChannelData_push_row
                             ((DctCoderChannelData *)
                              ((long)(me->_channelData->_dctData)._dctData + lVar56 + -0x20),puVar59
                             );
          if (eVar48 != 0) {
            eVar48 = 1;
            if (iVar50 <= iVar4) {
              return 1;
            }
            goto LAB_001089a4;
          }
          puVar59 = puVar59 + (long)*(char *)(lVar53 + 0x19) * (long)*(int *)(lVar53 + 0xc);
          iVar55 = me->_numChannels;
        }
        lVar56 = lVar56 + 0x240;
      }
      iVar50 = iVar50 + 1;
    }
LAB_001089a4:
    lVar56 = 8;
    for (uVar62 = 0; uVar62 < (ulong)(long)me->_numCscChannelSets; uVar62 = uVar62 + 1) {
      pCVar10 = me->_channelData;
      pCVar11 = me->_cscChannelSets;
      iVar55 = *(int *)((long)pCVar11->idx + lVar56 + -8);
      if (pCVar10[iVar55].compression != LOSSY_DCT) {
        return 0x17;
      }
      iVar50 = *(int *)((long)pCVar11->idx + lVar56 + -4);
      if (pCVar10[iVar50].compression != LOSSY_DCT) {
        return 0x17;
      }
      iVar4 = *(int *)((long)pCVar11->idx + lVar56);
      if (pCVar10[iVar4].compression != LOSSY_DCT) {
        return 0x17;
      }
      tmpc._16_8_ = local_e0 + nRaw * 2;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_e0;
      tmpc._0_16_ = auVar46 << 0x40;
      eVar48 = LossyDctDecoder_execute((LossyDctDecoder *)&tmpc);
      pCVar10 = me->_channelData;
      pCVar10[iVar55].processed = 1;
      pCVar10[iVar50].processed = 1;
      pCVar10[iVar4].processed = 1;
      if (eVar48 != 0) {
        return eVar48;
      }
      local_e0 = local_e0 + (long)(int)tmpc._suffix * 2;
      lVar56 = lVar56 + 0xc;
      eVar48 = 0;
    }
    lVar56 = 0x210;
    for (uVar62 = 0; uVar62 < (ulong)(long)me->_numChannels; uVar62 = uVar62 + 1) {
      pCVar10 = me->_channelData;
      if (pCVar10[uVar62].processed == 0) {
        peVar12 = pCVar10[uVar62].chan;
        cVar3 = peVar12->bytes_per_element;
        CVar5 = pCVar10[uVar62].compression;
        if (CVar5 == UNKNOWN) {
          __n = (long)(int)cVar3 * (long)peVar12->width;
          iVar50 = 0;
          for (iVar55 = me->_min[1]; iVar55 <= me->_max[1]; iVar55 = iVar55 + 1) {
            if (iVar55 % peVar12->y_samples == 0) {
              if (me->_planarUncBuffer[0] + me->_planarUncBufferSize[0] <
                  pCVar10[uVar62].planarUncBufferEnd + __n) {
                return 0x17;
              }
              memcpy(pCVar10[uVar62]._dctData._rows[iVar50],pCVar10[uVar62].planarUncBufferEnd,__n);
              pCVar10[uVar62].planarUncBufferEnd = pCVar10[uVar62].planarUncBufferEnd + __n;
              iVar50 = iVar50 + 1;
            }
          }
        }
        else if (CVar5 == RLE) {
          iVar55 = me->_min[1];
          uVar60 = 0;
          uVar61 = (ulong)(uint)(int)cVar3;
          if (cVar3 < '\x01') {
            uVar61 = uVar60;
          }
          for (; iVar55 <= me->_max[1]; iVar55 = iVar55 + 1) {
            if (iVar55 % peVar12->y_samples == 0) {
              puVar59 = pCVar10[uVar62]._dctData._rows[(int)uVar60];
              if (cVar3 == '\x02') {
                puVar51 = pCVar10[uVar62].planarUncRleEnd[0];
                puVar13 = pCVar10[uVar62].planarUncRleEnd[1];
                uVar6 = peVar12->width;
                lVar53 = (long)(int)uVar6;
                uVar54 = (long)(int)uVar6 / 0x10;
                iVar50 = (int)uVar54;
                if ((((uint)puVar51 | (uint)puVar13 | (uint)puVar59) & 0xf) == 0) {
                  uVar57 = 0;
                  if (0 < iVar50) {
                    uVar57 = uVar54 & 0xffffffff;
                  }
                  for (lVar63 = 0; uVar57 * 0x10 != lVar63; lVar63 = lVar63 + 0x10) {
                    puVar1 = puVar51 + lVar63;
                    uVar14 = puVar1[1];
                    uVar15 = puVar1[2];
                    uVar16 = puVar1[3];
                    uVar17 = puVar1[4];
                    uVar18 = puVar1[5];
                    uVar19 = puVar1[6];
                    uVar20 = puVar1[7];
                    uVar21 = puVar1[8];
                    uVar22 = puVar1[9];
                    uVar23 = puVar1[10];
                    uVar24 = puVar1[0xb];
                    uVar25 = puVar1[0xc];
                    uVar26 = puVar1[0xd];
                    uVar27 = puVar1[0xe];
                    uVar28 = puVar1[0xf];
                    puVar2 = puVar13 + lVar63;
                    uVar29 = *puVar2;
                    uVar30 = puVar2[1];
                    uVar31 = puVar2[2];
                    uVar32 = puVar2[3];
                    uVar33 = puVar2[4];
                    uVar34 = puVar2[5];
                    uVar35 = puVar2[6];
                    uVar36 = puVar2[7];
                    uVar37 = puVar2[8];
                    uVar38 = puVar2[9];
                    uVar39 = puVar2[10];
                    uVar40 = puVar2[0xb];
                    uVar41 = puVar2[0xc];
                    uVar42 = puVar2[0xd];
                    uVar43 = puVar2[0xe];
                    uVar44 = puVar2[0xf];
                    puVar2 = puVar59 + lVar63 * 2;
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar29;
                    puVar2[2] = uVar14;
                    puVar2[3] = uVar30;
                    puVar2[4] = uVar15;
                    puVar2[5] = uVar31;
                    puVar2[6] = uVar16;
                    puVar2[7] = uVar32;
                    puVar2[8] = uVar17;
                    puVar2[9] = uVar33;
                    puVar2[10] = uVar18;
                    puVar2[0xb] = uVar34;
                    puVar2[0xc] = uVar19;
                    puVar2[0xd] = uVar35;
                    puVar2[0xe] = uVar20;
                    puVar2[0xf] = uVar36;
                    puVar1 = puVar59 + lVar63 * 2 + 0x10;
                    *puVar1 = uVar21;
                    puVar1[1] = uVar37;
                    puVar1[2] = uVar22;
                    puVar1[3] = uVar38;
                    puVar1[4] = uVar23;
                    puVar1[5] = uVar39;
                    puVar1[6] = uVar24;
                    puVar1[7] = uVar40;
                    puVar1[8] = uVar25;
                    puVar1[9] = uVar41;
                    puVar1[10] = uVar26;
                    puVar1[0xb] = uVar42;
                    puVar1[0xc] = uVar27;
                    puVar1[0xd] = uVar43;
                    puVar1[0xe] = uVar28;
                    puVar1[0xf] = uVar44;
                  }
                  for (lVar63 = (long)(iVar50 << 4); lVar63 < lVar53; lVar63 = lVar63 + 1) {
                    puVar59[lVar63 * 2] = puVar51[lVar63];
                    puVar59[lVar63 * 2 + 1] = puVar13[lVar63];
                  }
                }
                else if (((((ulong)puVar59 & 0xf) == 0) && (((uint)puVar51 & 0xf) == 8)) &&
                        (((uint)puVar13 & 0xf) == 8)) {
                  uVar49 = 8;
                  if ((int)uVar6 < 8) {
                    uVar49 = uVar6;
                  }
                  uVar54 = (ulong)uVar49;
                  if ((int)uVar49 < 1) {
                    uVar54 = 0;
                  }
                  for (uVar57 = 0; uVar54 != uVar57; uVar57 = uVar57 + 1) {
                    puVar59[uVar57 * 2] = puVar51[uVar57];
                    puVar59[uVar57 * 2 + 1] = puVar13[uVar57];
                  }
                  if (8 < (int)uVar6) {
                    for (uVar54 = 0; ((uint)(lVar53 - 8U) & 0xfffffff0) != uVar54;
                        uVar54 = uVar54 + 0x10) {
                      puVar1 = puVar51 + uVar54 + 8;
                      uVar14 = puVar1[1];
                      uVar15 = puVar1[2];
                      uVar16 = puVar1[3];
                      uVar17 = puVar1[4];
                      uVar18 = puVar1[5];
                      uVar19 = puVar1[6];
                      uVar20 = puVar1[7];
                      puVar2 = puVar13 + uVar54 + 8;
                      uVar21 = *puVar2;
                      uVar22 = puVar2[1];
                      uVar23 = puVar2[2];
                      uVar24 = puVar2[3];
                      uVar25 = puVar2[4];
                      uVar26 = puVar2[5];
                      uVar27 = puVar2[6];
                      uVar28 = puVar2[7];
                      puVar2 = puVar59 + uVar54 * 2 + 0x10;
                      *puVar2 = *puVar1;
                      puVar2[1] = uVar21;
                      puVar2[2] = uVar14;
                      puVar2[3] = uVar22;
                      puVar2[4] = uVar15;
                      puVar2[5] = uVar23;
                      puVar2[6] = uVar16;
                      puVar2[7] = uVar24;
                      puVar2[8] = uVar17;
                      puVar2[9] = uVar25;
                      puVar2[10] = uVar18;
                      puVar2[0xb] = uVar26;
                      puVar2[0xc] = uVar19;
                      puVar2[0xd] = uVar27;
                      puVar2[0xe] = uVar20;
                      puVar2[0xf] = uVar28;
                      uVar14 = puVar51[uVar54 + 0x11];
                      uVar15 = puVar51[uVar54 + 0x12];
                      uVar16 = puVar51[uVar54 + 0x13];
                      uVar17 = puVar51[uVar54 + 0x14];
                      uVar18 = puVar51[uVar54 + 0x15];
                      uVar19 = puVar51[uVar54 + 0x16];
                      uVar20 = puVar51[uVar54 + 0x17];
                      uVar21 = puVar13[uVar54 + 0x10];
                      uVar22 = puVar13[uVar54 + 0x11];
                      uVar23 = puVar13[uVar54 + 0x12];
                      uVar24 = puVar13[uVar54 + 0x13];
                      uVar25 = puVar13[uVar54 + 0x14];
                      uVar26 = puVar13[uVar54 + 0x15];
                      uVar27 = puVar13[uVar54 + 0x16];
                      uVar28 = puVar13[uVar54 + 0x17];
                      puVar1 = puVar59 + uVar54 * 2 + 0x20;
                      *puVar1 = puVar51[uVar54 + 0x10];
                      puVar1[1] = uVar21;
                      puVar1[2] = uVar14;
                      puVar1[3] = uVar22;
                      puVar1[4] = uVar15;
                      puVar1[5] = uVar23;
                      puVar1[6] = uVar16;
                      puVar1[7] = uVar24;
                      puVar1[8] = uVar17;
                      puVar1[9] = uVar25;
                      puVar1[10] = uVar18;
                      puVar1[0xb] = uVar26;
                      puVar1[0xc] = uVar19;
                      puVar1[0xd] = uVar27;
                      puVar1[0xe] = uVar20;
                      puVar1[0xf] = uVar28;
                    }
                    for (uVar54 = lVar53 - 8U & 0xfffffffffffffff0 | 8; (long)uVar54 < lVar53;
                        uVar54 = uVar54 + 1) {
                      puVar59[uVar54 * 2] = puVar51[uVar54];
                      puVar59[uVar54 * 2 + 1] = puVar13[uVar54];
                    }
                  }
                }
                else {
                  uVar57 = 0;
                  if (0 < iVar50) {
                    uVar57 = uVar54 & 0xffffffff;
                  }
                  for (lVar63 = 0; uVar57 * 0x10 != lVar63; lVar63 = lVar63 + 0x10) {
                    puVar1 = puVar51 + lVar63;
                    uVar14 = puVar1[1];
                    uVar15 = puVar1[2];
                    uVar16 = puVar1[3];
                    uVar17 = puVar1[4];
                    uVar18 = puVar1[5];
                    uVar19 = puVar1[6];
                    uVar20 = puVar1[7];
                    uVar21 = puVar1[8];
                    uVar22 = puVar1[9];
                    uVar23 = puVar1[10];
                    uVar24 = puVar1[0xb];
                    uVar25 = puVar1[0xc];
                    uVar26 = puVar1[0xd];
                    uVar27 = puVar1[0xe];
                    uVar28 = puVar1[0xf];
                    puVar2 = puVar13 + lVar63;
                    uVar29 = *puVar2;
                    uVar30 = puVar2[1];
                    uVar31 = puVar2[2];
                    uVar32 = puVar2[3];
                    uVar33 = puVar2[4];
                    uVar34 = puVar2[5];
                    uVar35 = puVar2[6];
                    uVar36 = puVar2[7];
                    uVar37 = puVar2[8];
                    uVar38 = puVar2[9];
                    uVar39 = puVar2[10];
                    uVar40 = puVar2[0xb];
                    uVar41 = puVar2[0xc];
                    uVar42 = puVar2[0xd];
                    uVar43 = puVar2[0xe];
                    uVar44 = puVar2[0xf];
                    puVar2 = puVar59 + lVar63 * 2;
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar29;
                    puVar2[2] = uVar14;
                    puVar2[3] = uVar30;
                    puVar2[4] = uVar15;
                    puVar2[5] = uVar31;
                    puVar2[6] = uVar16;
                    puVar2[7] = uVar32;
                    puVar2[8] = uVar17;
                    puVar2[9] = uVar33;
                    puVar2[10] = uVar18;
                    puVar2[0xb] = uVar34;
                    puVar2[0xc] = uVar19;
                    puVar2[0xd] = uVar35;
                    puVar2[0xe] = uVar20;
                    puVar2[0xf] = uVar36;
                    puVar1 = puVar59 + lVar63 * 2 + 0x10;
                    *puVar1 = uVar21;
                    puVar1[1] = uVar37;
                    puVar1[2] = uVar22;
                    puVar1[3] = uVar38;
                    puVar1[4] = uVar23;
                    puVar1[5] = uVar39;
                    puVar1[6] = uVar24;
                    puVar1[7] = uVar40;
                    puVar1[8] = uVar25;
                    puVar1[9] = uVar41;
                    puVar1[10] = uVar26;
                    puVar1[0xb] = uVar42;
                    puVar1[0xc] = uVar27;
                    puVar1[0xd] = uVar43;
                    puVar1[0xe] = uVar28;
                    puVar1[0xf] = uVar44;
                  }
                  for (lVar63 = (long)(iVar50 << 4); lVar63 < lVar53; lVar63 = lVar63 + 1) {
                    puVar59[lVar63 * 2] = puVar51[lVar63];
                    puVar59[lVar63 * 2 + 1] = puVar13[lVar63];
                  }
                }
                iVar50 = peVar12->width;
                pCVar10[uVar62].planarUncRleEnd[0] = pCVar10[uVar62].planarUncRleEnd[0] + iVar50;
                pCVar10[uVar62].planarUncRleEnd[1] = pCVar10[uVar62].planarUncRleEnd[1] + iVar50;
              }
              else {
                for (iVar50 = 0; iVar50 < peVar12->width; iVar50 = iVar50 + 1) {
                  for (uVar54 = 0; uVar61 != uVar54; uVar54 = uVar54 + 1) {
                    puVar51 = *(uint8_t **)
                               ((long)(pCVar10->_dctData)._dctData + uVar54 * 8 + lVar56 + -0x20);
                    *(uint8_t **)((long)(pCVar10->_dctData)._dctData + uVar54 * 8 + lVar56 + -0x20)
                         = puVar51 + 1;
                    puVar59[uVar54] = *puVar51;
                  }
                  puVar59 = puVar59 + uVar54;
                }
              }
              uVar60 = (ulong)((int)uVar60 + 1);
            }
          }
        }
        else {
          if (CVar5 != LOSSY_DCT) {
            return 0x17;
          }
          tmpc._16_8_ = local_e0 + nRaw * 2;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = local_e0;
          tmpc._0_16_ = auVar47 << 0x40;
          eVar48 = LossyDctDecoder_execute((LossyDctDecoder *)&tmpc);
          if (eVar48 != 0) {
            return eVar48;
          }
          local_e0 = local_e0 + (long)(int)tmpc._suffix * 2;
          eVar48 = 0;
        }
        pCVar10[uVar62].processed = 1;
      }
      lVar56 = lVar56 + 0x240;
    }
  }
  return eVar48;
}

Assistant:

exr_result_t
DwaCompressor_uncompress (
    DwaCompressor* me,
    const uint8_t* inPtr,
    uint64_t       iSize,
    void*          uncompressed_data,
    uint64_t       uncompressed_size)
{
    uint64_t     headerSize = NUM_SIZES_SINGLE * sizeof (uint64_t);
    exr_result_t rv         = EXR_ERR_SUCCESS;

    if (iSize < headerSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated header).");
    }

    //
    // Flip the counters from XDR to NATIVE
    //
    uint64_t counters[NUM_SIZES_SINGLE];

    memset (uncompressed_data, 0, uncompressed_size);

    memcpy (counters, inPtr, headerSize);
    priv_to_native64 (counters, NUM_SIZES_SINGLE);

    //
    // Unwind all the counter info
    //
    uint64_t version                 = counters[VERSION];
    uint64_t unknownUncompressedSize = counters[UNKNOWN_UNCOMPRESSED_SIZE];
    uint64_t unknownCompressedSize   = counters[UNKNOWN_COMPRESSED_SIZE];
    uint64_t acCompressedSize        = counters[AC_COMPRESSED_SIZE];
    uint64_t dcCompressedSize        = counters[DC_COMPRESSED_SIZE];
    uint64_t rleCompressedSize       = counters[RLE_COMPRESSED_SIZE];
    uint64_t rleUncompressedSize     = counters[RLE_UNCOMPRESSED_SIZE];
    uint64_t rleRawSize              = counters[RLE_RAW_SIZE];

    uint64_t totalAcUncompressedCount = counters[AC_UNCOMPRESSED_COUNT];
    uint64_t totalDcUncompressedCount = counters[DC_UNCOMPRESSED_COUNT];

    uint64_t acCompression = counters[AC_COMPRESSION];

    uint64_t compressedSize = unknownCompressedSize + acCompressedSize +
                              dcCompressedSize + rleCompressedSize;

    const uint8_t* dataPtr  = inPtr + headerSize;
    uint64_t       dataLeft = iSize - headerSize;

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize || iSize < acCompressedSize ||
        iSize < dcCompressedSize || iSize < rleCompressedSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated file).");
    }

    if ((int64_t) unknownUncompressedSize < 0 ||
        (int64_t) unknownCompressedSize < 0 || (int64_t) acCompressedSize < 0 ||
        (int64_t) dcCompressedSize < 0 || (int64_t) rleCompressedSize < 0 ||
        (int64_t) rleUncompressedSize < 0 || (int64_t) rleRawSize < 0 ||
        (int64_t) totalAcUncompressedCount < 0 ||
        (int64_t) totalDcUncompressedCount < 0)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               " (corrupt header).");
    }

    if (version < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        uint64_t ruleSize;
        rv =
            DwaCompressor_readChannelRules (me, &dataPtr, &dataLeft, &ruleSize);

        headerSize += ruleSize;
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    size_t outBufferSize = 0;
    rv                   = DwaCompressor_initializeBuffers (me, &outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    // the C++ classes used to have one buffer size for compress / uncompress
    // but here we want to do zero-ish copy...
    uint8_t* outBufferEnd = (uint8_t*) me->_decode->unpacked_buffer;
    //if (outBufferSize > me->_decode->unpacked_alloc_size)
    //{
    //    printf( "outbuffersize %lu larger than unpacked size %lu\n", outBufferSize, me->_decode->unpacked_alloc_size );
    //    return EXR_ERR_OUT_OF_MEMORY;
    //}
    outBufferSize = me->_decode->unpacked_alloc_size;

    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy
    // if you want to decode the channels in parallel later on.
    //

    uint8_t* packedAcBufferEnd = 0;

    if (me->_packedAcBuffer) packedAcBufferEnd = me->_packedAcBuffer;

    uint8_t* packedDcBufferEnd = 0;

    if (me->_packedDcBuffer) packedDcBufferEnd = me->_packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the
    // Huffman-compressed AC, then the DC values,
    // and then the zlib compressed RLE data.
    //

    const uint8_t* compressedUnknownBuf = dataPtr;

    const uint8_t* compressedAcBuf =
        compressedUnknownBuf + (ptrdiff_t) (unknownCompressedSize);
    const uint8_t* compressedDcBuf =
        compressedAcBuf + (ptrdiff_t) (acCompressedSize);
    const uint8_t* compressedRleBuf =
        compressedDcBuf + (ptrdiff_t) (dcCompressedSize);

    //
    // Sanity check that the version is something we expect. Right now,
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the
    // start of the data block.
    //

    if (version > 2)
    {
        return EXR_ERR_BAD_CHUNK_LEADER;
        //throw IEX_NAMESPACE::InputExc (
        //    "Invalid version of compressed data block");
    }

    rv = DwaCompressor_setupChannelData (me);

    //
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > me->_planarUncBufferSize[UNKNOWN])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedUnknownBuf,
                                   unknownCompressedSize,
                                   me->_planarUncBuffer[UNKNOWN],
                                   unknownUncompressedSize,
                                   NULL))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing UNKNOWN data.");
        }
    }

    //
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if (!me->_packedAcBuffer ||
            totalAcUncompressedCount * sizeof (uint16_t) >
                me->_packedAcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
            case STATIC_HUFFMAN:
                rv = internal_huf_decompress (
                    me->_decode,
                    compressedAcBuf,
                    acCompressedSize,
                    (uint16_t*) me->_packedAcBuffer,
                    totalAcUncompressedCount,
                    me->_decode->scratch_buffer_1,
                    me->_decode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS) { return rv; }
                break;

            case DEFLATE: {
                size_t destLen;

                rv = exr_uncompress_buffer (
                    compressedAcBuf,
                    acCompressedSize,
                    me->_packedAcBuffer,
                    totalAcUncompressedCount * sizeof (uint16_t),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (uint16_t) != destLen)
                {
                    return EXR_ERR_CORRUPT_CHUNK;
                    //throw IEX_NAMESPACE::InputExc ("AC data corrupt.");
                }
            }
            break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
                break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        size_t destLen;
        size_t uncompBytes = totalDcUncompressedCount * sizeof (uint16_t);
        if (uncompBytes > me->_packedDcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        rv = internal_decode_alloc_buffer (
            me->_decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_decode->scratch_buffer_1),
            &(me->_decode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = exr_uncompress_buffer (
            compressedDcBuf,
            dcCompressedSize,
            me->_decode->scratch_buffer_1,
            uncompBytes,
            &destLen);
        if (rv != EXR_ERR_SUCCESS || (uncompBytes != destLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }

        internal_zip_reconstruct_bytes (
            me->_packedDcBuffer, (uint8_t*) me->_decode->scratch_buffer_1, uncompBytes);
    }
    else
    {
        // if the compressed size is 0, then the uncompressed size must also be zero
        if (totalDcUncompressedCount != 0)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > me->_rleBufferSize ||
            rleRawSize > me->_planarUncBufferSize[RLE])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        size_t dstLen;

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedRleBuf,
                                   rleCompressedSize,
                                   me->_rleBuffer,
                                   rleUncompressedSize,
                                   &dstLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }

        if (internal_rle_decompress (
                me->_planarUncBuffer[RLE],
                rleRawSize,
                (const uint8_t*) me->_rleBuffer,
                rleUncompressedSize) != rleRawSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), outBufferEnd);
            if (rv != EXR_ERR_SUCCESS) return rv;

            outBufferEnd += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctDecoder decoder;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        int rChan = cset->idx[0];
        int gChan = cset->idx[1];
        int bChan = cset->idx[2];

        if (me->_channelData[rChan].compression != LOSSY_DCT ||
            me->_channelData[gChan].compression != LOSSY_DCT ||
            me->_channelData[bChan].compression != LOSSY_DCT)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Bad DWA compression type detected");
        }

        rv = LossyDctDecoderCsc_construct (
            &decoder,
            &(me->_channelData[rChan]._dctData),
            &(me->_channelData[gChan]._dctData),
            &(me->_channelData[bChan]._dctData),
            packedAcBufferEnd,
            packedAcBufferEnd + totalAcUncompressedCount * sizeof (uint16_t),
            packedDcBufferEnd,
            dwaCompressorToLinear,
            me->_channelData[rChan].chan->width,
            me->_channelData[rChan].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctDecoder_execute (&decoder);

        packedAcBufferEnd += decoder._packedAcCount * sizeof (uint16_t);

        packedDcBufferEnd += decoder._packedDcCount * sizeof (uint16_t);

        me->_channelData[rChan].processed = 1;
        me->_channelData[gChan].processed = 1;
        me->_channelData[bChan].processed = 1;

        LossyDctDecoder_destroy (&decoder);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*               cd      = &(me->_channelData[c]);
        exr_coding_channel_info_t* chan    = cd->chan;
        DctCoderChannelData*       dcddata = &(cd->_dctData);

        if (cd->processed) continue;

        int pixelSize = chan->bytes_per_element;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // Setup a single-channel lossy DCT decoder pointing
                // at the output buffer
                //

                {
                    const uint16_t* linearLut = NULL;
                    LossyDctDecoder decoder;

                    if (!chan->p_linear) linearLut = dwaCompressorToLinear;

                    rv = LossyDctDecoder_construct (
                        &decoder,
                        dcddata,
                        packedAcBufferEnd,
                        packedAcBufferEnd +
                            totalAcUncompressedCount * sizeof (uint16_t),
                        packedDcBufferEnd,
                        linearLut,
                        chan->width,
                        chan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctDecoder_execute (&decoder);

                    packedAcBufferEnd +=
                        decoder._packedAcCount * sizeof (uint16_t);

                    packedDcBufferEnd +=
                        decoder._packedDcCount * sizeof (uint16_t);

                    LossyDctDecoder_destroy (&decoder);
                    if (rv != EXR_ERR_SUCCESS) { return rv; }
                }

                break;

            case RLE:

                //
                // For the RLE case, the data has been un-RLE'd into
                // planarUncRleEnd[], but is still split out by bytes.
                // We need to rearrange the bytes back into the correct
                // order in the output buffer;
                //

                {
                    int row = 0;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        uint8_t* dst = dcddata->_rows[row];

                        if (pixelSize == 2)
                        {
                            interleaveByte2 (
                                dst,
                                cd->planarUncRleEnd[0],
                                cd->planarUncRleEnd[1],
                                chan->width);

                            cd->planarUncRleEnd[0] += chan->width;
                            cd->planarUncRleEnd[1] += chan->width;
                        }
                        else
                        {
                            for (int x = 0; x < chan->width; ++x)
                            {
                                for (int byte = 0; byte < pixelSize; ++byte)
                                {
                                    *dst++ = *cd->planarUncRleEnd[byte]++;
                                }
                            }
                        }

                        row++;
                    }
                }

                break;

            case UNKNOWN:

                //
                // In the UNKNOWN case, data is already in planarUncBufferEnd
                // and just needs to copied over to the output buffer
                //

                {
                    int row             = 0;
                    int dstScanlineSize = chan->width * pixelSize;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        //
                        // sanity check for buffer data lying within range
                        //
                        if ((cd->planarUncBufferEnd +
                             (size_t) (dstScanlineSize)) >
                            (me->_planarUncBuffer[UNKNOWN] +
                             me->_planarUncBufferSize[UNKNOWN]))
                        {
                            return EXR_ERR_CORRUPT_CHUNK;
                            //throw IEX_NAMESPACE::InputExc ("DWA data corrupt");
                        }

                        memcpy (
                            dcddata->_rows[row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                        cd->planarUncBufferEnd += dstScanlineSize;
                        row++;
                    }
                }

                break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc (
                //    "Unhandled compression scheme case");
                break;
        }

        cd->processed = 1;
    }

    return rv;
}